

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::NLConstraint>
::Container::Container(Container *this,int d,NLConstraint *c)

{
  undefined4 in_ESI;
  NLConstraint *in_RDI;
  NLConstraint *this_00;
  NLConstraint local_e8;
  undefined4 local_c;
  
  this_00 = &local_e8;
  local_c = in_ESI;
  NLConstraint::NLConstraint(this_00,in_RDI);
  ExprWrapper<mp::NLConstraint>::ExprWrapper((ExprWrapper<mp::NLConstraint> *)this_00,in_RDI);
  NLConstraint::~NLConstraint(this_00);
  *(undefined4 *)&in_RDI[1].super_BasicConstraint.name_ = local_c;
  Context::Context((Context *)&in_RDI[1].super_BasicConstraint.name_.field_0x4,CTX_NONE);
  *(undefined1 *)&in_RDI[1].super_BasicConstraint.name_._M_string_length = 0;
  *(undefined1 *)((long)&in_RDI[1].super_BasicConstraint.name_._M_string_length + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1].super_BasicConstraint.name_._M_string_length + 2) = 0;
  return;
}

Assistant:

Container(int d, Constraint&& c) noexcept
      : con_(std::move(c)), depth_(d) { }